

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::HttpClientAdapter::DelayedCloseWebSocket::receive(DelayedCloseWebSocket *this)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  _func_int **in_RSI;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar2;
  Own<kj::_::PromiseNode> OStack_58;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::PromiseNode> local_28;
  
  (**(code **)(*(long *)in_RSI[2] + 0x30))(&OStack_58);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&OStack_58,
             _::
             TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>,_kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:4377:36),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042c5f0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>,kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>,kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket::receive()::{lambda(kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>&&)#1},kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)this_00;
  _::maybeChain<kj::OneOf<kj::String,kj::Array<unsigned_char>,kj::WebSocket::Close>>
            (&local_38,
             (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
             &intermediate);
  pPVar1 = local_38.ptr;
  local_28.disposer = local_38.disposer;
  local_38.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_38);
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)local_38.disposer;
  (this->inner).disposer = (Disposer *)pPVar1;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_28);
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose(&OStack_58);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
      return inner->receive().then([this](Message&& message) -> kj::Promise<Message> {
        if (message.is<WebSocket::Close>()) {
          return afterReceiveClosed()
              .then([message = kj::mv(message)]() mutable { return kj::mv(message); });
        }
        return kj::mv(message);
      });
    }